

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O2

void __thiscall Refal2::CModuleBuilder::SetEmpty(CModuleBuilder *this,CToken *nameToken)

{
  bool bVar1;
  CPreparatoryFunction *function;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = addFunction(this,nameToken);
    bVar1 = checkOnlyDeclared(this,function,nameToken);
    if (bVar1) {
      CPreparatoryFunction::SetDefined(function,nameToken);
      CPreparatoryFunction::SetEmpty(function);
      return;
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetEmpty( const CToken& nameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		function.SetDefined( nameToken );
		function.SetEmpty();
	}
}